

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Exception * __thiscall
kj::_::NullableValue<kj::Exception>::emplace<kj::Exception>
          (NullableValue<kj::Exception> *this,Exception *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    Exception::~Exception(&(this->field_1).value);
  }
  Exception::Exception(&(this->field_1).value,params);
  this->isSet = true;
  return (Exception *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }